

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedString::GenerateInlineAccessorDefinitions
          (RepeatedString *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined8 uVar1;
  bool bVar2;
  Type TVar3;
  Sub *local_330;
  basic_string_view<char,_std::char_traits<char>_> local_300;
  basic_string_view<char,_std::char_traits<char>_> local_2e8;
  basic_string_view<char,_std::char_traits<char>_> local_2d0;
  undefined1 local_2b9;
  anon_class_16_2_a3e1f7ce_for_cb local_2b8;
  allocator<char> local_2a1;
  string local_2a0;
  Sub *local_270;
  Sub local_268;
  Sub local_1b0;
  Sub local_f8;
  iterator local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  bool local_19;
  undefined8 uStack_18;
  bool bytes;
  Printer *p_local;
  RepeatedString *this_local;
  
  uStack_18 = p;
  p_local = (Printer *)this;
  TVar3 = FieldDescriptor::type((this->super_FieldGeneratorBase).field_);
  uVar1 = uStack_18;
  local_19 = TVar3 == TYPE_BYTES;
  local_2b9 = 1;
  local_270 = &local_268;
  GetEmitRepeatedFieldGetterSub(local_270,this->opts_,(Printer *)uStack_18);
  local_270 = &local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"bytes_tag",&local_2a1);
  local_2b8.bytes = &local_19;
  local_2b8.p = (Printer **)&stack0xffffffffffffffe8;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::RepeatedString::GenerateInlineAccessorDefinitions(google::protobuf::io::Printer*)const::__0>
            (&local_1b0,&local_2a0,&local_2b8);
  local_270 = &local_f8;
  GetEmitRepeatedFieldMutableSub(local_270,this->opts_,(Printer *)uStack_18,false);
  local_2b9 = 0;
  local_40 = &local_268;
  local_38 = 3;
  v._M_len = 3;
  v._M_array = local_40;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_30._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2d0,
             "\n        inline ::std::string* $nonnull$ $Msg$::add_$name$()\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          ::std::string* _s = _internal_mutable_$name_internal$()->Add();\n          $annotate_add_mutable$;\n          // @@protoc_insertion_point(field_add_mutable:$pkg.Msg.field$)\n          return _s;\n        }\n        inline const ::std::string& $Msg$::$name$(int index) const\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_get$;\n          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)\n          return $getter$;\n        }\n        inline ::std::string* $nonnull$ $Msg$::mutable_$name$(int index)\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_mutable$;\n          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)\n          return $mutable$;\n        }\n        template <typename Arg_, typename... Args_>\n        inline void $Msg$::set_$name$(int index, Arg_&& value, Args_... args) {\n          $WeakDescriptorSelfPin$;\n          $pbi$::AssignToString(*$mutable$, ::std::forward<Arg_>(value),\n                                args... $bytes_tag$);\n          $annotate_set$;\n          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)\n        }\n        template <typename Arg_, typename... Args_>\n        inline void $Msg$::add_$name$(Arg_&& value, Args_... args) {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          $pbi$::AddToRepeatedPtrField(*_internal_mutable_$name_internal$(),\n                                       ::std::forward<Arg_>(value),\n                                       args... $bytes_tag$);\n          $annotate_add$;\n          // @@protoc_insertion_point(field_add:$pkg.Msg.field$)\n        }\n        inline const $pb$::RepeatedPtrField<::std::string>& $Msg$::$name$()\n            const ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_list$;\n   ..." /* TRUNCATED STRING LITERAL */
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)uVar1,local_30._M_allocated_capacity,local_30._8_8_,local_2d0._M_len,
                    local_2d0._M_str);
  local_330 = (Sub *)&local_40;
  do {
    local_330 = local_330 + -1;
    io::Printer::Sub::~Sub(local_330);
  } while (local_330 != &local_268);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  bVar2 = FieldGeneratorBase::should_split(&this->super_FieldGeneratorBase);
  uVar1 = uStack_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2e8,
               "\n      inline const $pb$::RepeatedPtrField<::std::string>&\n      $Msg$::_internal_$name_internal$() const {\n        $TsanDetectConcurrentRead$;\n        return *$field_$;\n      }\n      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$\n      $Msg$::_internal_mutable_$name_internal$() {\n        $TsanDetectConcurrentRead$;\n        $PrepareSplitMessageForWrite$;\n        if ($field_$.IsDefault()) {\n          $field_$.Set(\n              $pb$::Arena::Create<$pb$::RepeatedPtrField<::std::string>>(\n                  GetArena()));\n        }\n        return $field_$.Get();\n      }\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)uVar1,local_2e8._M_len,local_2e8._M_str);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_300,
               "\n      inline const $pb$::RepeatedPtrField<::std::string>&\n      $Msg$::_internal_$name_internal$() const {\n        $TsanDetectConcurrentRead$;\n        return $field_$;\n      }\n      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$\n      $Msg$::_internal_mutable_$name_internal$() {\n        $TsanDetectConcurrentRead$;\n        return &$field_$;\n      }\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)uVar1,local_300._M_len,local_300._M_str);
  }
  return;
}

Assistant:

void RepeatedString::GenerateInlineAccessorDefinitions(io::Printer* p) const {
  bool bytes = field_->type() == FieldDescriptor::TYPE_BYTES;
  p->Emit(
      {
          GetEmitRepeatedFieldGetterSub(*opts_, p),
          {"bytes_tag",
           [&] {
             if (bytes) {
               p->Emit(", $pbi$::BytesTag{}");
             }
           }},
          GetEmitRepeatedFieldMutableSub(*opts_, p),
      },
      R"cc(
        inline ::std::string* $nonnull$ $Msg$::add_$name$()
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          ::std::string* _s = _internal_mutable_$name_internal$()->Add();
          $annotate_add_mutable$;
          // @@protoc_insertion_point(field_add_mutable:$pkg.Msg.field$)
          return _s;
        }
        inline const ::std::string& $Msg$::$name$(int index) const
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_get$;
          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)
          return $getter$;
        }
        inline ::std::string* $nonnull$ $Msg$::mutable_$name$(int index)
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_mutable$;
          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)
          return $mutable$;
        }
        template <typename Arg_, typename... Args_>
        inline void $Msg$::set_$name$(int index, Arg_&& value, Args_... args) {
          $WeakDescriptorSelfPin$;
          $pbi$::AssignToString(*$mutable$, ::std::forward<Arg_>(value),
                                args... $bytes_tag$);
          $annotate_set$;
          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)
        }
        template <typename Arg_, typename... Args_>
        inline void $Msg$::add_$name$(Arg_&& value, Args_... args) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $pbi$::AddToRepeatedPtrField(*_internal_mutable_$name_internal$(),
                                       ::std::forward<Arg_>(value),
                                       args... $bytes_tag$);
          $annotate_add$;
          // @@protoc_insertion_point(field_add:$pkg.Msg.field$)
        }
        inline const $pb$::RepeatedPtrField<::std::string>& $Msg$::$name$()
            const ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_list$;
          // @@protoc_insertion_point(field_list:$pkg.Msg.field$)
          return _internal_$name_internal$();
        }
        inline $pb$::RepeatedPtrField<::std::string>* $nonnull$
        $Msg$::mutable_$name$() ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_mutable_list$;
          // @@protoc_insertion_point(field_mutable_list:$pkg.Msg.field$)
          $TsanDetectConcurrentMutation$;
          return _internal_mutable_$name_internal$();
        }
      )cc");
  if (should_split()) {
    p->Emit(R"cc(
      inline const $pb$::RepeatedPtrField<::std::string>&
      $Msg$::_internal_$name_internal$() const {
        $TsanDetectConcurrentRead$;
        return *$field_$;
      }
      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$
      $Msg$::_internal_mutable_$name_internal$() {
        $TsanDetectConcurrentRead$;
        $PrepareSplitMessageForWrite$;
        if ($field_$.IsDefault()) {
          $field_$.Set(
              $pb$::Arena::Create<$pb$::RepeatedPtrField<::std::string>>(
                  GetArena()));
        }
        return $field_$.Get();
      }
    )cc");
  } else {
    p->Emit(R"cc(
      inline const $pb$::RepeatedPtrField<::std::string>&
      $Msg$::_internal_$name_internal$() const {
        $TsanDetectConcurrentRead$;
        return $field_$;
      }
      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$
      $Msg$::_internal_mutable_$name_internal$() {
        $TsanDetectConcurrentRead$;
        return &$field_$;
      }
    )cc");
  }
}